

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

Allocation * __thiscall
google::protobuf::DescriptorPool::Tables::
CreateFlatAlloc<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
          (Tables *this,
          TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
          *sizes)

{
  int iVar1;
  int iVar2;
  _Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
  *this_00;
  pointer __last;
  int iVar3;
  int iVar4;
  int iVar5;
  FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *pFVar6;
  long lVar7;
  _Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
  *this_01;
  pointer __result;
  pointer puVar8;
  pointer puVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  Base<char> BVar19;
  long *plVar20;
  Tables *__alloc;
  int iVar21;
  size_t __n;
  int iVar22;
  int iVar23;
  int iVar24;
  size_t __n_00;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  
  iVar1 = (sizes->payload_).super_Base<char>.value;
  iVar31 = (sizes->payload_).super_Base<google::protobuf::SourceCodeInfo>.value * 0x48;
  iVar3 = (sizes->payload_).super_Base<google::protobuf::FileDescriptorTables>.value * 200;
  iVar30 = (sizes->payload_).super_Base<google::protobuf::FeatureSet>.value * 0x50;
  iVar25 = (sizes->payload_).super_Base<google::protobuf::MessageOptions>.value * 0x58;
  iVar26 = (sizes->payload_).super_Base<google::protobuf::FieldOptions>.value * 0x98;
  iVar27 = (sizes->payload_).super_Base<google::protobuf::EnumOptions>.value * 0x58;
  iVar28 = (sizes->payload_).super_Base<google::protobuf::EnumValueOptions>.value * 0x60;
  iVar29 = (sizes->payload_).super_Base<google::protobuf::ExtensionRangeOptions>.value * 0x70;
  iVar32 = (sizes->payload_).super_Base<google::protobuf::OneofOptions>.value * 0x50;
  iVar21 = (sizes->payload_).super_Base<google::protobuf::ServiceOptions>.value * 0x58;
  iVar23 = (sizes->payload_).super_Base<google::protobuf::MethodOptions>.value * 0x58;
  iVar24 = (sizes->payload_).super_Base<google::protobuf::FileOptions>.value * 0xb0;
  iVar10 = (sizes->payload_).
           super_Base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .value * 0x20;
  iVar22 = iVar1 + iVar10;
  iVar2 = iVar31 + iVar22;
  iVar11 = iVar3 + iVar2;
  iVar4 = iVar30 + iVar11;
  iVar12 = iVar25 + iVar4;
  iVar13 = iVar26 + iVar12;
  iVar14 = iVar27 + iVar13;
  iVar15 = iVar28 + iVar14;
  iVar16 = iVar29 + iVar15;
  iVar17 = iVar16 + iVar32;
  iVar18 = iVar17 + iVar21;
  iVar5 = iVar23 + iVar18;
  pFVar6 = (FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            *)operator_new((long)(iVar5 + iVar24) + 0x38);
  iVar10 = iVar10 + 0x38 + iVar1;
  BVar19.value = iVar1 + 0x38;
  (pFVar6->ends_).payload_.super_Base<char>.value = BVar19.value;
  (pFVar6->ends_).payload_.
  super_Base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.value
       = iVar10;
  (pFVar6->ends_).payload_.super_Base<google::protobuf::SourceCodeInfo>.value =
       iVar22 + iVar31 + 0x38;
  (pFVar6->ends_).payload_.super_Base<google::protobuf::FileDescriptorTables>.value =
       iVar3 + 0x38 + iVar2;
  (pFVar6->ends_).payload_.super_Base<google::protobuf::FeatureSet>.value = iVar30 + 0x38 + iVar11;
  (pFVar6->ends_).payload_.super_Base<google::protobuf::MessageOptions>.value =
       iVar25 + 0x38 + iVar4;
  (pFVar6->ends_).payload_.super_Base<google::protobuf::FieldOptions>.value = iVar26 + 0x38 + iVar12
  ;
  (pFVar6->ends_).payload_.super_Base<google::protobuf::EnumOptions>.value = iVar27 + 0x38 + iVar13;
  (pFVar6->ends_).payload_.super_Base<google::protobuf::EnumValueOptions>.value =
       iVar28 + 0x38 + iVar14;
  (pFVar6->ends_).payload_.super_Base<google::protobuf::ExtensionRangeOptions>.value =
       iVar29 + 0x38 + iVar15;
  (pFVar6->ends_).payload_.super_Base<google::protobuf::OneofOptions>.value = iVar32 + 0x38 + iVar16
  ;
  (pFVar6->ends_).payload_.super_Base<google::protobuf::ServiceOptions>.value =
       iVar21 + 0x38 + iVar17;
  (pFVar6->ends_).payload_.super_Base<google::protobuf::MethodOptions>.value =
       iVar23 + 0x38 + iVar18;
  (pFVar6->ends_).payload_.super_Base<google::protobuf::FileOptions>.value = iVar24 + 0x38 + iVar5;
  plVar20 = (long *)((long)&(pFVar6->ends_).payload_.super_Base<char>.value + (long)BVar19.value);
  for (lVar7 = (long)iVar10 - (long)BVar19.value; lVar7 != 0; lVar7 = lVar7 + -0x20) {
    *plVar20 = (long)(plVar20 + 2);
    plVar20[1] = 0;
    *(undefined1 *)(plVar20 + 2) = 0;
    plVar20 = plVar20 + 4;
  }
  iVar2 = (pFVar6->ends_).payload_.super_Base<google::protobuf::SourceCodeInfo>.value;
  for (lVar7 = (long)(pFVar6->ends_).payload_.
                     super_Base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .value; iVar2 != lVar7; lVar7 = lVar7 + 0x48) {
    SourceCodeInfo::SourceCodeInfo
              ((SourceCodeInfo *)((long)&(pFVar6->ends_).payload_.super_Base<char>.value + lVar7));
  }
  iVar2 = (pFVar6->ends_).payload_.super_Base<google::protobuf::FileDescriptorTables>.value;
  for (lVar7 = (long)(pFVar6->ends_).payload_.super_Base<google::protobuf::SourceCodeInfo>.value;
      iVar2 != lVar7; lVar7 = lVar7 + 200) {
    FileDescriptorTables::FileDescriptorTables
              ((FileDescriptorTables *)
               ((long)&(pFVar6->ends_).payload_.super_Base<char>.value + lVar7));
  }
  iVar2 = (pFVar6->ends_).payload_.super_Base<google::protobuf::FeatureSet>.value;
  for (lVar7 = (long)(pFVar6->ends_).payload_.super_Base<google::protobuf::FileDescriptorTables>.
                     value; iVar2 != lVar7; lVar7 = lVar7 + 0x50) {
    FeatureSet::FeatureSet
              ((FeatureSet *)((long)&(pFVar6->ends_).payload_.super_Base<char>.value + lVar7));
  }
  iVar2 = (pFVar6->ends_).payload_.super_Base<google::protobuf::MessageOptions>.value;
  for (lVar7 = (long)(pFVar6->ends_).payload_.super_Base<google::protobuf::FeatureSet>.value;
      iVar2 != lVar7; lVar7 = lVar7 + 0x58) {
    MessageOptions::MessageOptions
              ((MessageOptions *)((long)&(pFVar6->ends_).payload_.super_Base<char>.value + lVar7));
  }
  iVar2 = (pFVar6->ends_).payload_.super_Base<google::protobuf::FieldOptions>.value;
  for (lVar7 = (long)(pFVar6->ends_).payload_.super_Base<google::protobuf::MessageOptions>.value;
      iVar2 != lVar7; lVar7 = lVar7 + 0x98) {
    FieldOptions::FieldOptions
              ((FieldOptions *)((long)&(pFVar6->ends_).payload_.super_Base<char>.value + lVar7));
  }
  iVar2 = (pFVar6->ends_).payload_.super_Base<google::protobuf::EnumOptions>.value;
  for (lVar7 = (long)(pFVar6->ends_).payload_.super_Base<google::protobuf::FieldOptions>.value;
      iVar2 != lVar7; lVar7 = lVar7 + 0x58) {
    EnumOptions::EnumOptions
              ((EnumOptions *)((long)&(pFVar6->ends_).payload_.super_Base<char>.value + lVar7));
  }
  iVar2 = (pFVar6->ends_).payload_.super_Base<google::protobuf::EnumValueOptions>.value;
  for (lVar7 = (long)(pFVar6->ends_).payload_.super_Base<google::protobuf::EnumOptions>.value;
      iVar2 != lVar7; lVar7 = lVar7 + 0x60) {
    EnumValueOptions::EnumValueOptions
              ((EnumValueOptions *)((long)&(pFVar6->ends_).payload_.super_Base<char>.value + lVar7))
    ;
  }
  iVar2 = (pFVar6->ends_).payload_.super_Base<google::protobuf::ExtensionRangeOptions>.value;
  for (lVar7 = (long)(pFVar6->ends_).payload_.super_Base<google::protobuf::EnumValueOptions>.value;
      iVar2 != lVar7; lVar7 = lVar7 + 0x70) {
    ExtensionRangeOptions::ExtensionRangeOptions
              ((ExtensionRangeOptions *)
               ((long)&(pFVar6->ends_).payload_.super_Base<char>.value + lVar7));
  }
  iVar2 = (pFVar6->ends_).payload_.super_Base<google::protobuf::OneofOptions>.value;
  for (lVar7 = (long)(pFVar6->ends_).payload_.super_Base<google::protobuf::ExtensionRangeOptions>.
                     value; iVar2 != lVar7; lVar7 = lVar7 + 0x50) {
    OneofOptions::OneofOptions
              ((OneofOptions *)((long)&(pFVar6->ends_).payload_.super_Base<char>.value + lVar7));
  }
  iVar2 = (pFVar6->ends_).payload_.super_Base<google::protobuf::ServiceOptions>.value;
  for (lVar7 = (long)(pFVar6->ends_).payload_.super_Base<google::protobuf::OneofOptions>.value;
      iVar2 != lVar7; lVar7 = lVar7 + 0x58) {
    ServiceOptions::ServiceOptions
              ((ServiceOptions *)((long)&(pFVar6->ends_).payload_.super_Base<char>.value + lVar7));
  }
  iVar2 = (pFVar6->ends_).payload_.super_Base<google::protobuf::MethodOptions>.value;
  for (lVar7 = (long)(pFVar6->ends_).payload_.super_Base<google::protobuf::ServiceOptions>.value;
      iVar2 != lVar7; lVar7 = lVar7 + 0x58) {
    MethodOptions::MethodOptions
              ((MethodOptions *)((long)&(pFVar6->ends_).payload_.super_Base<char>.value + lVar7));
  }
  iVar2 = (pFVar6->ends_).payload_.super_Base<google::protobuf::FileOptions>.value;
  for (lVar7 = (long)(pFVar6->ends_).payload_.super_Base<google::protobuf::MethodOptions>.value;
      iVar2 != lVar7; lVar7 = lVar7 + 0xb0) {
    FileOptions::FileOptions
              ((FileOptions *)((long)&(pFVar6->ends_).payload_.super_Base<char>.value + lVar7));
  }
  puVar9 = (this->flat_allocs_).
           super__Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar9 == (this->flat_allocs_).
                super__Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __n_00 = 1;
    __alloc = this;
    this_01 = (_Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
               *)std::
                 vector<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
                 ::_M_check_len(&this->flat_allocs_,1,"vector::_M_realloc_insert");
    this_00 = (_Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
               *)(this->flat_allocs_).
                 super__Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    __last = (this->flat_allocs_).
             super__Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __result = std::
               _Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
               ::_M_allocate(this_01,__n_00);
    *(FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      **)((long)__result + ((long)puVar9 - (long)this_00)) = pFVar6;
    puVar8 = std::
             vector<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
             ::_S_relocate((pointer)this_00,puVar9,__result,(_Tp_alloc_type *)__alloc);
    puVar9 = std::
             vector<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
             ::_S_relocate(puVar9,__last,puVar8 + 1,(_Tp_alloc_type *)__alloc);
    std::
    _Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
    ::_M_deallocate(this_00,(pointer)((long)(this->flat_allocs_).
                                            super__Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)this_00 >> 3),__n);
    (this->flat_allocs_).
    super__Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (this->flat_allocs_).
    super__Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)this_01;
  }
  else {
    (puVar9->_M_t).
    super___uniq_ptr_impl<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>_*,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
    .
    super__Head_base<0UL,_google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>_*,_false>
    ._M_head_impl = pFVar6;
    puVar9 = (this->flat_allocs_).
             super__Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  (this->flat_allocs_).
  super__Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar9;
  return pFVar6;
}

Assistant:

internal::FlatAllocator::Allocation* DescriptorPool::Tables::CreateFlatAlloc(
    const TypeMap<IntT, T...>& sizes) {
  auto ends = CalculateEnds(sizes);
  using FlatAlloc = internal::FlatAllocator::Allocation;

  int last_end = ends.template Get<
      typename std::tuple_element<sizeof...(T) - 1, std::tuple<T...>>::type>();
  size_t total_size =
      last_end + RoundUpTo<FlatAlloc::kMaxAlign>(sizeof(FlatAlloc));
  char* data = static_cast<char*>(::operator new(total_size));
  auto* res = ::new (data) FlatAlloc(ends);
  flat_allocs_.emplace_back(res);

  return res;
}